

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_dxil_builtins.cpp
# Opt level: O0

void dxil_spv::update_raw_access_tracking_from_vector_type
               (AccessTracking *tracking,Type *type,RawVecSize vec_size)

{
  TypeID TVar1;
  uint uVar2;
  RawVecSize vec_size_local;
  Type *type_local;
  AccessTracking *tracking_local;
  
  TVar1 = LLVMBC::Type::getTypeID(type);
  if (TVar1 == HalfTyID) {
    tracking->raw_access_buffer_declarations[0][1][(int)vec_size] = true;
  }
  else {
    TVar1 = LLVMBC::Type::getTypeID(type);
    if (TVar1 == FloatTyID) {
      tracking->raw_access_buffer_declarations[0][2][(int)vec_size] = true;
    }
    else {
      TVar1 = LLVMBC::Type::getTypeID(type);
      if (TVar1 == DoubleTyID) {
        tracking->raw_access_buffer_declarations[1][3][(int)vec_size] = true;
      }
      else {
        TVar1 = LLVMBC::Type::getTypeID(type);
        if (TVar1 == IntegerTyID) {
          uVar2 = LLVMBC::Type::getIntegerBitWidth(type);
          if (uVar2 == 0x10) {
            tracking->raw_access_buffer_declarations[0][1][(int)vec_size] = true;
          }
          else {
            uVar2 = LLVMBC::Type::getIntegerBitWidth(type);
            if (uVar2 == 0x20) {
              tracking->raw_access_buffer_declarations[0][2][(int)vec_size] = true;
            }
            else {
              uVar2 = LLVMBC::Type::getIntegerBitWidth(type);
              if (uVar2 == 0x40) {
                tracking->raw_access_buffer_declarations[0][3][(int)vec_size] = true;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void update_raw_access_tracking_from_vector_type(Converter::Impl::AccessTracking &tracking,
                                                        const llvm::Type *type, RawVecSize vec_size)
{
	// For SSBOs, always use uint types, except for 64-bit since Float64 vs Int64 are two separate features.
	if (type->getTypeID() == llvm::Type::TypeID::HalfTyID)
		tracking.raw_access_buffer_declarations[int(RawType::Integer)][int(RawWidth::B16)][int(vec_size)] = true;
	else if (type->getTypeID() == llvm::Type::TypeID::FloatTyID)
		tracking.raw_access_buffer_declarations[int(RawType::Integer)][int(RawWidth::B32)][int(vec_size)] = true;
	else if (type->getTypeID() == llvm::Type::TypeID::DoubleTyID)
		tracking.raw_access_buffer_declarations[int(RawType::Float)][int(RawWidth::B64)][int(vec_size)] = true;
	else if (type->getTypeID() == llvm::Type::TypeID::IntegerTyID)
	{
		if (type->getIntegerBitWidth() == 16)
			tracking.raw_access_buffer_declarations[int(RawType::Integer)][int(RawWidth::B16)][int(vec_size)] = true;
		else if (type->getIntegerBitWidth() == 32)
			tracking.raw_access_buffer_declarations[int(RawType::Integer)][int(RawWidth::B32)][int(vec_size)] = true;
		else if (type->getIntegerBitWidth() == 64)
			tracking.raw_access_buffer_declarations[int(RawType::Integer)][int(RawWidth::B64)][int(vec_size)] = true;
	}
}